

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O1

HaF64 Determinant3x3(HaF64 (*matrix) [3],HaF64 *error)

{
  HaF64 HVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  HaI32 i;
  long lVar7;
  HaF64 (*paHVar8) [3];
  long lVar9;
  HaI32 k;
  long lVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  HaF64 cofactor [2] [2];
  
  auVar15 = ZEXT816(0) << 0x40;
  dVar16 = -1.0;
  lVar7 = 0;
  auVar14 = ZEXT816(0) << 0x40;
  do {
    paHVar8 = matrix;
    lVar9 = 0;
    do {
      lVar10 = 0;
      iVar11 = 0;
      do {
        if (lVar7 != lVar10) {
          cofactor[lVar9][iVar11] = (*paHVar8)[lVar10];
          iVar11 = iVar11 + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      paHVar8 = paHVar8 + 1;
      bVar12 = lVar9 == 0;
      lVar9 = lVar9 + 1;
    } while (bVar12);
    dVar2 = (double)cofactor[0][0] * (double)cofactor[1][1];
    dVar3 = (double)cofactor[0][1] * (double)cofactor[1][0];
    auVar21._0_8_ = -dVar2;
    auVar21._8_8_ = 0x8000000000000000;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar2;
    uVar4 = vcmpsd_avx512f(auVar21,auVar17,2);
    bVar12 = (bool)((byte)uVar4 & 1);
    auVar23._0_8_ = -dVar3;
    auVar23._8_8_ = 0x8000000000000000;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar3;
    uVar4 = vcmpsd_avx512f(auVar23,auVar19,2);
    bVar5 = (bool)((byte)uVar4 & 1);
    HVar1 = matrix[2][lVar7];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = HVar1;
    auVar24._0_8_ = (HaF64)-(double)HVar1;
    auVar24._8_8_ = 0x8000000000000000;
    uVar4 = vcmpsd_avx512f(auVar24,auVar20,6);
    bVar6 = (bool)((byte)uVar4 & 1);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16 * (dVar2 - dVar3);
    auVar14 = vfmadd231sd_fma(auVar14,auVar20,auVar18);
    auVar13._0_8_ = (ulong)bVar6 * (long)auVar24._0_8_ + (ulong)!bVar6 * (long)HVar1;
    auVar13._8_8_ = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (double)((ulong)bVar12 * (long)dVar2 + (ulong)!bVar12 * (long)auVar21._0_8_) +
         (double)((ulong)bVar5 * (long)dVar3 + (ulong)!bVar5 * (long)auVar23._0_8_);
    auVar15 = vfmadd231sd_fma(auVar15,auVar22,auVar13);
    dVar16 = -dVar16;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  *error = auVar15._0_8_;
  return auVar14._0_8_;
}

Assistant:

hacd::HaF64 Determinant3x3 (const hacd::HaF64 matrix[3][3], hacd::HaF64* const error)
{
	hacd::HaF64 sign = hacd::HaF64 (-1.0f);
	hacd::HaF64 det = hacd::HaF64 (0.0f);
	hacd::HaF64 accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 3; i ++)  {
		hacd::HaF64 cofactor[2][2];
		for (hacd::HaI32 j = 0; j < 2; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 3; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		hacd::HaF64 parcialError;
		hacd::HaF64 minorDet = Determinant2x2 (cofactor, &parcialError);
		accError += parcialError * Absolute (matrix[2][i]);
		det += sign * minorDet * matrix[2][i];
		sign *= hacd::HaF64 (-1.0f);
	}

	*error = accError;
	return det;
}